

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::AddCacheEntry
          (cmCacheManager *this,string *key,char *value,char *helpString,CacheEntryType type)

{
  mapped_type *this_00;
  long lVar1;
  char *value_00;
  pointer path;
  allocator local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
            ::operator[](&this->Cache,key);
  if (value == (char *)0x0) {
    std::__cxx11::string::assign((char *)this_00);
  }
  else {
    std::__cxx11::string::assign((char *)this_00);
    this_00->Initialized = true;
  }
  this_00->Type = type;
  if (type - PATH < 2) {
    lVar1 = std::__cxx11::string::find((char)this_00,0x3b);
    if (lVar1 == -1) {
      cmsys::SystemTools::ConvertToUnixSlashes(&this_00->Value);
    }
    else {
      paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&this_00->Value,&paths,false);
      std::__cxx11::string::assign((char *)this_00);
      for (path = paths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          path != paths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
        cmsys::SystemTools::ConvertToUnixSlashes(path);
        std::__cxx11::string::append((char *)this_00);
        std::__cxx11::string::append((string *)this_00);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&paths);
    }
  }
  std::__cxx11::string::string((string *)&paths,"HELPSTRING",&local_59);
  value_00 = "(This variable does not exist and should not be used)";
  if (helpString != (char *)0x0) {
    value_00 = helpString;
  }
  CacheEntry::SetProperty(this_00,(string *)&paths,value_00);
  std::__cxx11::string::~string((string *)&paths);
  return;
}

Assistant:

void cmCacheManager::AddCacheEntry(const std::string& key,
                                   const char* value,
                                   const char* helpString,
                                   cmState::CacheEntryType type)
{
  CacheEntry& e = this->Cache[key];
  if ( value )
    {
    e.Value = value;
    e.Initialized = true;
    }
  else
    {
    e.Value = "";
    }
  e.Type = type;
  // make sure we only use unix style paths
  if(type == cmState::FILEPATH || type == cmState::PATH)
    {
    if(e.Value.find(';') != e.Value.npos)
      {
      std::vector<std::string> paths;
      cmSystemTools::ExpandListArgument(e.Value, paths);
      const char* sep = "";
      e.Value = "";
      for(std::vector<std::string>::iterator i = paths.begin();
          i != paths.end(); ++i)
        {
        cmSystemTools::ConvertToUnixSlashes(*i);
        e.Value += sep;
        e.Value += *i;
        sep = ";";
        }
      }
    else
      {
      cmSystemTools::ConvertToUnixSlashes(e.Value);
      }
    }
  e.SetProperty("HELPSTRING", helpString? helpString :
                "(This variable does not exist and should not be used)");
}